

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

RegOpnd * __thiscall
Lowerer::LoadObjectArray(Lowerer *this,RegOpnd *baseOpnd,Instr *insertBeforeInstr)

{
  Func *func;
  code *pcVar1;
  bool bVar2;
  ObjectType OVar3;
  ValueType valueType;
  DWORD offset;
  undefined4 *puVar4;
  ArrayRegOpnd *this_00;
  RegOpnd *this_01;
  Opnd *this_02;
  StackSym *pSVar5;
  IndirOpnd *src;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_48 [4];
  AutoReuseOpnd autoReuseArrayOpnd;
  
  if (baseOpnd == (RegOpnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3baf,"(baseOpnd)","baseOpnd");
    if (!bVar2) goto LAB_00574a79;
    *puVar4 = 0;
  }
  local_48[0] = (baseOpnd->super_Opnd).m_valueType.field_0;
  bVar2 = ValueType::IsLikelyObject((ValueType *)&local_48[0].field_0);
  if (bVar2) {
    autoReuseArrayOpnd._22_2_ = (baseOpnd->super_Opnd).m_valueType.field_0;
    OVar3 = ValueType::GetObjectType((ValueType *)&autoReuseArrayOpnd.field_0x16);
    if (OVar3 != ObjectWithArray) goto LAB_00574916;
  }
  else {
LAB_00574916:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3bb2,
                       "(baseOpnd->GetValueType().IsLikelyObject() && baseOpnd->GetValueType().GetObjectType() == ObjectType::ObjectWithArray)"
                       ,
                       "baseOpnd->GetValueType().IsLikelyObject() && baseOpnd->GetValueType().GetObjectType() == ObjectType::ObjectWithArray"
                      );
    if (!bVar2) goto LAB_00574a79;
    *puVar4 = 0;
  }
  if (insertBeforeInstr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3bb3,"(insertBeforeInstr)","insertBeforeInstr");
    if (!bVar2) {
LAB_00574a79:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  func = insertBeforeInstr->m_func;
  bVar2 = IR::RegOpnd::IsArrayRegOpnd(baseOpnd);
  if (bVar2) {
    this_00 = IR::RegOpnd::AsArrayRegOpnd(baseOpnd);
    this_01 = IR::ArrayRegOpnd::CopyAsRegOpnd(this_00,func);
  }
  else {
    this_02 = IR::Opnd::Copy(&baseOpnd->super_Opnd,func);
    this_01 = IR::Opnd::AsRegOpnd(this_02);
  }
  pSVar5 = StackSym::New(TyVar,func);
  this_01->m_sym = pSVar5;
  local_48[0] = (this_01->super_Opnd).m_valueType.field_0;
  valueType = ValueType::ToArray((ValueType *)&local_48[0].field_0);
  IR::Opnd::SetValueType(&this_01->super_Opnd,valueType);
  IR::AutoReuseOpnd::AutoReuseOpnd
            ((AutoReuseOpnd *)&local_48[0].field_0,&this_01->super_Opnd,func,false);
  offset = Js::DynamicObject::GetOffsetOfObjectArray();
  src = IR::IndirOpnd::New(baseOpnd,offset,(this_01->super_Opnd).m_type,func,false);
  InsertMove(&this_01->super_Opnd,&src->super_Opnd,insertBeforeInstr,true);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&local_48[0].field_0);
  return this_01;
}

Assistant:

IR::RegOpnd *Lowerer::LoadObjectArray(IR::RegOpnd *const baseOpnd, IR::Instr *const insertBeforeInstr)
{
    Assert(baseOpnd);
    Assert(
        baseOpnd->GetValueType().IsLikelyObject() &&
        baseOpnd->GetValueType().GetObjectType() == ObjectType::ObjectWithArray);
    Assert(insertBeforeInstr);

    Func *const func = insertBeforeInstr->m_func;

    // mov  array, [base + offsetOf(objectArrayOrFlags)]
    IR::RegOpnd *const arrayOpnd =
        baseOpnd->IsArrayRegOpnd() ? baseOpnd->AsArrayRegOpnd()->CopyAsRegOpnd(func) : baseOpnd->Copy(func)->AsRegOpnd();
    arrayOpnd->m_sym = StackSym::New(TyVar, func);
    arrayOpnd->SetValueType(arrayOpnd->GetValueType().ToArray());
    const IR::AutoReuseOpnd autoReuseArrayOpnd(arrayOpnd, func, false /* autoDelete */);
    InsertMove(
        arrayOpnd,
        IR::IndirOpnd::New(
            baseOpnd,
            Js::DynamicObject::GetOffsetOfObjectArray(),
            arrayOpnd->GetType(),
            func),
        insertBeforeInstr);

    return arrayOpnd;
}